

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

unique_pointer<const_pstore::uint128> __thiscall
pstore::database::getrou<pstore::uint128,void>
          (database *this,typed_address<pstore::uint128> addr,size_t elements)

{
  value_type vVar1;
  address size;
  _Head_base<0UL,_const_pstore::uint128_*,_false> extraout_RDX;
  unique_pointer<const_pstore::uint128> uVar2;
  address local_30;
  size_t elements_local;
  database *this_local;
  typed_address<pstore::uint128> addr_local;
  
  elements_local = (size_t)addr.a_.a_;
  this_local = (database *)elements;
  addr_local.a_.a_ = (address)(address)this;
  local_30 = typed_address<pstore::uint128>::to_address
                       ((typed_address<pstore::uint128> *)&this_local);
  vVar1 = address::absolute(&stack0xffffffffffffffd0);
  if ((vVar1 & 0xf) != 0) {
    raise<pstore::error_code>(bad_alignment);
  }
  size = typed_address<pstore::uint128>::to_address((typed_address<pstore::uint128> *)&this_local);
  getrou((database *)&stack0xffffffffffffffc0,addr.a_.a_,size.a_);
  unique_pointer_cast<pstore::uint128_const,void_const>
            ((pstore *)this,(unique_pointer<const_void> *)&stack0xffffffffffffffc0);
  std::unique_ptr<const_void,_void_(*)(const_void_*)>::~unique_ptr
            ((unique_ptr<const_void,_void_(*)(const_void_*)> *)&stack0xffffffffffffffc0);
  uVar2._M_t.super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>._M_t.
  super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>.
  super__Head_base<0UL,_const_pstore::uint128_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar2._M_t.super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>._M_t.
  super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_pstore::uint128_*)>.
  super__Head_base<1UL,_void_(*)(const_pstore::uint128_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_pstore::uint128_*),_false>)
       (_Head_base<1UL,_void_(*)(const_pstore::uint128_*),_false>)this;
  return (unique_pointer<const_pstore::uint128>)
         uVar2._M_t.super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>.
         _M_t.super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>;
}

Assistant:

auto database::getrou (typed_address<T> const addr, std::size_t const elements) const
        -> unique_pointer<T const> {
        if (addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        return unique_pointer_cast<T const> (
            this->getrou (addr.to_address (), sizeof (T) * elements));
    }